

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseCompiler::addInvokeNode
          (BaseCompiler *this,InvokeNode **out,InstId instId,Operand_ *o0,FuncSignature *signature)

{
  InstOptions IVar1;
  InstOptions IVar2;
  RegOnly RVar3;
  char *__s;
  Error EVar4;
  int iVar5;
  undefined4 extraout_var;
  InvokeNode *node;
  
  IVar1 = (this->super_BaseBuilder).super_BaseEmitter._forcedInstOptions;
  IVar2 = (this->super_BaseBuilder).super_BaseEmitter._instOptions;
  RVar3 = (this->super_BaseBuilder).super_BaseEmitter._extraReg;
  __s = (this->super_BaseBuilder).super_BaseEmitter._inlineComment;
  (this->super_BaseBuilder).super_BaseEmitter._instOptions = kNone;
  (this->super_BaseBuilder).super_BaseEmitter._extraReg._signature = 0;
  *(undefined8 *)&(this->super_BaseBuilder).super_BaseEmitter._extraReg._id = 0;
  *(undefined4 *)((long)&(this->super_BaseBuilder).super_BaseEmitter._inlineComment + 4) = 0;
  EVar4 = newInvokeNode(this,out,instId,o0,signature);
  if (EVar4 == 0) {
    node = *out;
    *(InstOptions *)&node->field_0x34 = IVar1 | IVar2;
    *(uint32_t *)&node->field_0x38 = RVar3._signature._bits._bits;
    *(uint32_t *)&node->field_0x3c = RVar3._id;
    if (__s != (char *)0x0) {
      strlen(__s);
      iVar5 = Zone::dup(&(this->super_BaseBuilder)._dataZone,(int)__s);
      *(ulong *)&node->field_0x28 = CONCAT44(extraout_var,iVar5);
      node = *out;
    }
    BaseBuilder::addNode(&this->super_BaseBuilder,(BaseNode *)node);
  }
  return EVar4;
}

Assistant:

Error BaseCompiler::addInvokeNode(InvokeNode** out, InstId instId, const Operand_& o0, const FuncSignature& signature) {
  State state = _grabState();

  ASMJIT_PROPAGATE(newInvokeNode(out, instId, o0, signature));
  ASMJIT_ASSUME(*out != nullptr);

  BaseBuilder_assignInstState(this, *out, state);
  addNode(*out);
  return kErrorOk;
}